

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcLightSourceAmbient::~IfcLightSourceAmbient(IfcLightSourceAmbient *this)

{
  LazyObject *pLVar1;
  bool *pbVar2;
  
  *(undefined8 *)&this[-1].super_IfcLightSource.super_IfcGeometricRepresentationItem.field_0x28 =
       0x8b3388;
  *(undefined8 *)
   &(this->super_IfcLightSource).super_IfcGeometricRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 = 0x8b3400;
  *(undefined8 *)&this[-1].super_IfcLightSource.field_0x38 = 0x8b33b0;
  *(undefined8 *)&this[-1].super_IfcLightSource.field_0x48 = 0x8b33d8;
  pLVar1 = this[-1].super_IfcLightSource.LightColour.obj;
  pbVar2 = &this[-1].super_IfcLightSource.AmbientIntensity.have;
  if (pLVar1 != (LazyObject *)pbVar2) {
    operator_delete(pLVar1,*(long *)pbVar2 + 1);
  }
  operator_delete(&this[-1].super_IfcLightSource.super_IfcGeometricRepresentationItem.field_0x28,
                  0xa8);
  return;
}

Assistant:

IfcLightSourceAmbient() : Object("IfcLightSourceAmbient") {}